

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-101.cpp
# Opt level: O3

bool __thiscall
baryonyx::itm::
solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>
::
compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
          (solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>
           *this,bit_array *x,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> last,
          longdouble kappa,longdouble delta,longdouble theta)

{
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  long lVar1;
  int *piVar2;
  bool bVar3;
  uint uVar4;
  row_iterator prVar5;
  long lVar6;
  rc_data *__first;
  long lVar7;
  rc_data *prVar8;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  int selected;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  int local_b8;
  int local_b4;
  rc_size local_b0;
  rc_data *local_a8;
  bit_array *local_a0;
  solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>
  *local_98;
  int *local_90;
  undefined8 local_88;
  int *local_80;
  undefined1 local_78 [16];
  longdouble local_68;
  longdouble local_58;
  longdouble local_48;
  
  local_48 = kappa;
  local_58 = delta;
  local_68 = theta;
  fmt._M_str = "update-row {} {} {}\n";
  fmt._M_len = 0x14;
  debug_logger<true>::log<long_double,long_double,long_double>
            ((debug_logger<true> *)this,fmt,&local_48,&local_58,&local_68);
  if (first._M_current == last._M_current) {
    local_88 = 0;
  }
  else {
    local_98 = this + 0x10;
    local_88 = 0;
    local_a0 = x;
    local_90 = last._M_current;
    do {
      local_b8 = *first._M_current;
      local_80 = first._M_current;
      sparse_matrix<int>::row((sparse_matrix<int> *)local_78,(int)local_98);
      if (local_78._8_8_ != local_78._0_8_) {
        lVar7 = *(long *)(this + 0x50);
        prVar5 = (row_iterator)local_78._8_8_;
        do {
          piVar2 = &prVar5->value;
          prVar5 = prVar5 + 1;
          lVar6 = (long)*piVar2 * 0x10;
          *(longdouble *)(lVar7 + lVar6) = *(longdouble *)(lVar7 + lVar6) * local_68;
        } while (prVar5 != (row_iterator)local_78._0_8_);
      }
      local_b0 = solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
                 ::compute_reduced_costs<baryonyx::bit_array>
                           ((solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
                             *)this,(row_iterator)local_78._8_8_,(row_iterator)local_78._0_8_,x);
      uVar4 = local_b0.r_size;
      if (1 < (int)uVar4) {
        __first = *(rc_data **)(this + 0x68);
        __g = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)(this + 8);
        prVar8 = __first + (int)uVar4;
        std::
        __introsort_loop<baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,prVar8,(int)LZCOUNT((ulong)(uVar4 & 0x7fffffff)) * 2 ^ 0x7e);
        local_a8 = prVar8;
        std::
        __final_insertion_sort<baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,prVar8);
        lVar7 = (long)(int)uVar4 * 0x20 + -0x20;
        prVar8 = __first;
        do {
          prVar8 = prVar8 + 1;
          if ((__first->value != prVar8->value) || (NAN(__first->value) || NAN(prVar8->value))) {
            std::
            shuffle<baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                      (__first,prVar8,__g);
            __first = prVar8;
          }
          lVar7 = lVar7 + -0x20;
        } while (lVar7 != 0);
        std::
        shuffle<baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  (__first,local_a8,__g);
      }
      local_b4 = solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
                 ::select_variables((solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
                                     *)this,&local_b0,
                                    *(int *)(*(long *)(this + 0x70) + (long)local_b8 * 0xc),
                                    *(int *)(*(long *)(this + 0x70) + 4 + (long)local_b8 * 0xc));
      fmt_00._M_str = "constraints {}: {} <= ";
      fmt_00._M_len = 0x16;
      debug_logger<true>::log<int,int>
                ((debug_logger<true> *)this,fmt_00,&local_b8,
                 (int *)((long)local_b8 * 0xc + *(long *)(this + 0x70)));
      if (0 < local_b0.r_size) {
        lVar7 = 0x14;
        lVar6 = 0;
        do {
          lVar1 = *(long *)(this + 0x68);
          fmt_01._M_str = "{} ({} {}) ";
          fmt_01._M_len = 0xb;
          debug_logger<true>::log<int,long_double,int>
                    ((debug_logger<true> *)this,fmt_01,(int *)(lVar1 + -4 + lVar7),
                     (longdouble *)(lVar1 + -0x14 + lVar7),(int *)(lVar1 + lVar7));
          lVar6 = lVar6 + 1;
          lVar7 = lVar7 + 0x20;
        } while (lVar6 < local_b0.r_size);
      }
      fmt_02._M_str = "<= {} => Selected: {}\n";
      fmt_02._M_len = 0x16;
      debug_logger<true>::log<int,int>
                ((debug_logger<true> *)this,fmt_02,
                 (int *)(*(long *)(this + 0x70) + 4 + (long)local_b8 * 0xc),&local_b4);
      x = local_a0;
      bVar3 = affect<baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,long_double>
                        ((solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
                          *)this,local_a0,(row_value *)local_78._8_8_,local_b8,local_b4,
                         local_b0.r_size,local_48,local_58);
      local_88 = CONCAT71((int7)((ulong)local_88 >> 8),(byte)local_88 | bVar3);
      first._M_current = local_80 + 1;
    } while (first._M_current != local_90);
  }
  return (bool)((byte)local_88 & 1);
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto sizes =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            calculator_sort<Mode>(R.get(), R.get() + sizes.r_size, rng);
            int selected = select_variables(sizes, b[k].min, b[k].max);

            logger::log("constraints {}: {} <= ", k, b[k].min);

            for (int i = 0; i < sizes.r_size; ++i)
                logger::log("{} ({} {}) ", R[i].f, R[i].value, R[i].id);

            logger::log("<= {} => Selected: {}\n", b[k].max, selected);

            auto pi_change = affect(*this,
                                    x,
                                    std::get<0>(it),
                                    k,
                                    selected,
                                    sizes.r_size,
                                    kappa,
                                    delta);

            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }